

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicBlock.cc
# Opt level: O2

unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> __thiscall
flow::BasicBlock::replace
          (BasicBlock *this,Instr *oldInstr,
          unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> *newInstr)

{
  Instr *pIVar1;
  __uniq_ptr_impl<flow::Instr,_std::default_delete<flow::Instr>_> *p_Var2;
  uint __line;
  TerminateInstr *pTVar3;
  long lVar4;
  __uniq_ptr_impl<flow::Instr,_std::default_delete<flow::Instr>_> *in_RCX;
  long lVar5;
  pointer *__ptr;
  __uniq_ptr_impl<flow::Instr,_std::default_delete<flow::Instr>_> *this_00;
  char *__assertion;
  _Head_base<0UL,_flow::Instr_*,_false> local_28;
  
  if (newInstr[9]._M_t.super___uniq_ptr_impl<flow::Instr,_std::default_delete<flow::Instr>_>._M_t.
      super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
      super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl != oldInstr) {
    __assertion = "oldInstr->getBasicBlock() == this";
    __line = 0x56;
    goto LAB_00134ee5;
  }
  pIVar1 = (in_RCX->_M_t).super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
           super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl;
  if (pIVar1->basicBlock_ != (BasicBlock *)0x0) {
    __assertion = "newInstr->getBasicBlock() == nullptr";
    __line = 0x57;
    goto LAB_00134ee5;
  }
  Value::replaceAllUsesWith((Value *)newInstr,&pIVar1->super_Value);
  pTVar3 = getTerminator((BasicBlock *)oldInstr);
  if (pTVar3 == (TerminateInstr *)newInstr) {
    remove(this,(char *)oldInstr);
    local_28._M_head_impl =
         (in_RCX->_M_t).super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
         super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl;
    (in_RCX->_M_t).super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
    super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl = (Instr *)0x0;
    push_back((BasicBlock *)oldInstr,
              (unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> *)&local_28);
    if (local_28._M_head_impl == (Instr *)0x0) {
      return (unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>)this;
    }
    (*((local_28._M_head_impl)->super_Value)._vptr_Value[1])();
    return (unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>)this;
  }
  pIVar1 = (in_RCX->_M_t).super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
           super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl;
  if ((pIVar1 != (Instr *)0x0) &&
     (lVar4 = __dynamic_cast(pIVar1,&Instr::typeinfo,&TerminateInstr::typeinfo,0), lVar4 != 0)) {
    __assertion = 
    "dynamic_cast<TerminateInstr*>(newInstr.get()) == nullptr && \"Most not be a terminator instruction.\""
    ;
    __line = 0x60;
    goto LAB_00134ee5;
  }
  this_00 = (__uniq_ptr_impl<flow::Instr,_std::default_delete<flow::Instr>_> *)
            (oldInstr->operands_).super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  p_Var2 = (__uniq_ptr_impl<flow::Instr,_std::default_delete<flow::Instr>_> *)
           (oldInstr->operands_).super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)p_Var2 - (long)this_00;
  for (lVar5 = lVar4 >> 5; 0 < lVar5; lVar5 = lVar5 + -1) {
    if ((this_00->_M_t).super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
        super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl == (Instr *)newInstr)
    goto LAB_00134e50;
    if (this_00[1]._M_t.super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
        super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl == (Instr *)newInstr) {
      this_00 = this_00 + 1;
      goto LAB_00134e50;
    }
    if (this_00[2]._M_t.super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
        super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl == (Instr *)newInstr) {
      this_00 = this_00 + 2;
      goto LAB_00134e50;
    }
    if (this_00[3]._M_t.super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
        super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl == (Instr *)newInstr) {
      this_00 = this_00 + 3;
      goto LAB_00134e50;
    }
    this_00 = this_00 + 4;
    lVar4 = lVar4 + -0x20;
  }
  lVar4 = lVar4 >> 3;
  if (lVar4 == 1) {
LAB_00134e37:
    if ((this_00->_M_t).super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
        super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl != (Instr *)newInstr) {
      this_00 = p_Var2;
    }
LAB_00134e50:
    if (this_00 != p_Var2) {
      newInstr[9]._M_t.super___uniq_ptr_impl<flow::Instr,_std::default_delete<flow::Instr>_>._M_t.
      super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
      super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl = (Instr *)0x0;
      ((in_RCX->_M_t).super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
       super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl)->basicBlock_ =
           (BasicBlock *)oldInstr;
      (this->super_Value)._vptr_Value =
           (_func_int **)
           (this_00->_M_t).super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
           super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl;
      (this_00->_M_t).super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
      super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl = (Instr *)0x0;
      std::__uniq_ptr_impl<flow::Instr,_std::default_delete<flow::Instr>_>::operator=
                (this_00,in_RCX);
      return (__uniq_ptr_data<flow::Instr,_std::default_delete<flow::Instr>,_true,_true>)
             (__uniq_ptr_data<flow::Instr,_std::default_delete<flow::Instr>,_true,_true>)this;
    }
  }
  else {
    if (lVar4 == 2) {
LAB_00134e2e:
      if ((this_00->_M_t).super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
          super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl != (Instr *)newInstr) {
        this_00 = this_00 + 1;
        goto LAB_00134e37;
      }
      goto LAB_00134e50;
    }
    if (lVar4 == 3) {
      if ((this_00->_M_t).super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
          super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl != (Instr *)newInstr) {
        this_00 = this_00 + 1;
        goto LAB_00134e2e;
      }
      goto LAB_00134e50;
    }
  }
  __assertion = "i != code_.end()";
  __line = 0x66;
LAB_00134ee5:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/BasicBlock.cc"
                ,__line,
                "std::unique_ptr<Instr> flow::BasicBlock::replace(Instr *, std::unique_ptr<Instr>)")
  ;
}

Assistant:

std::unique_ptr<Instr> BasicBlock::replace(Instr* oldInstr,
                                           std::unique_ptr<Instr> newInstr) {
  assert(oldInstr->getBasicBlock() == this);
  assert(newInstr->getBasicBlock() == nullptr);

  oldInstr->replaceAllUsesWith(newInstr.get());

  if (oldInstr == getTerminator()) {
    std::unique_ptr<Instr> removedInstr = remove(oldInstr);
    push_back(std::move(newInstr));
    return removedInstr;
  } else {
    assert(dynamic_cast<TerminateInstr*>(newInstr.get()) == nullptr && "Most not be a terminator instruction.");

    auto i = std::find_if(
        code_.begin(), code_.end(),
        [&](const auto& obj) { return obj.get() == oldInstr; });

    assert(i != code_.end());

    oldInstr->setParent(nullptr);
    newInstr->setParent(this);

    std::unique_ptr<Instr> removedInstr = std::move(*i);
    *i = std::move(newInstr);
    return removedInstr;
  }
}